

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

FaceData * __thiscall
Ptex::v2_2::PtexReader::ConstantFace::reduce
          (ConstantFace *this,PtexReader *param_2,Res param_3,ReduceFn *param_4,size_t *newMemUsed)

{
  FaceData *pFVar1;
  ConstantFace *in_RDI;
  long *in_R8;
  ConstantFace *pf;
  int in_stack_ffffffffffffffac;
  
  pFVar1 = (FaceData *)operator_new(0x18);
  ConstantFace(in_RDI,in_stack_ffffffffffffffac);
  *in_R8 = (long)*(int *)&(in_RDI->super_PackedFace).super_FaceData.field_0xc + 0x18;
  memcpy(pFVar1[1].super_PtexFaceData._vptr_PtexFaceData,(in_RDI->super_PackedFace)._data,
         (long)*(int *)&(in_RDI->super_PackedFace).super_FaceData.field_0xc);
  return pFVar1;
}

Assistant:

PtexReader::FaceData* PtexReader::ConstantFace::reduce(PtexReader*, Res, PtexUtils::ReduceFn, size_t& newMemUsed)
{
    // must make a new constant face (even though it's identical to this one)
    // because it will be owned by a different reduction level
    // and will therefore have a different parent
    ConstantFace* pf = new ConstantFace(_pixelsize);
    newMemUsed = sizeof(ConstantFace) + _pixelsize;
    memcpy(pf->_data, _data, _pixelsize);
    return pf;
}